

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O1

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::ResultModifier::Deserialize(ResultModifier *this,Deserializer *deserializer)

{
  ResultModifierType RVar1;
  uint uVar2;
  SerializationException *this_00;
  pointer *__ptr;
  string str;
  undefined1 local_48 [32];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    RVar1 = EnumUtil::FromString<duckdb::ResultModifierType>((char *)local_48._0_8_);
    uVar2 = (uint)RVar1;
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this->_vptr_ResultModifier = (_func_int **)0x0;
  switch(uVar2 & 0xff) {
  case 1:
    LimitModifier::Deserialize((LimitModifier *)local_48,deserializer);
    break;
  case 2:
    OrderModifier::Deserialize((OrderModifier *)local_48,deserializer);
    break;
  case 3:
    DistinctModifier::Deserialize((DistinctModifier *)local_48,deserializer);
    break;
  case 4:
    LimitPercentModifier::Deserialize((LimitPercentModifier *)local_48,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_48 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unsupported type for deserialization of ResultModifier!","");
    SerializationException::SerializationException(this_00,(string *)local_48);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_ResultModifier = (_func_int **)local_48._0_8_;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> ResultModifier::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ResultModifierType>(100, "type");
	unique_ptr<ResultModifier> result;
	switch (type) {
	case ResultModifierType::DISTINCT_MODIFIER:
		result = DistinctModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::LIMIT_MODIFIER:
		result = LimitModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::LIMIT_PERCENT_MODIFIER:
		result = LimitPercentModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::ORDER_MODIFIER:
		result = OrderModifier::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ResultModifier!");
	}
	return result;
}